

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderVariableManagerGL::StorageBufferBindInfo::BindResource
          (StorageBufferBindInfo *this,BindResourceInfo *BindInfo)

{
  ShaderResourceCacheGL *this_00;
  IDeviceObject *pIVar1;
  PipelineResourceDesc *ResDesc;
  ResourceAttribs *pRVar2;
  CachedSSBO *pCVar3;
  char (*in_RCX) [109];
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  char *SignatureName;
  RefCntAutoPtr<Diligent::BufferViewGLImpl> pViewGL;
  string msg;
  
  ResDesc = GetResourceDesc((this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                            ).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                            .m_ParentManager,
                            (this->
                            super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                            ).
                            super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                            .m_ResIndex);
  pRVar2 = GetResourceAttribs((this->
                              super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                              ).
                              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                              .m_ParentManager,
                              (this->
                              super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                              ).
                              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                              .m_ResIndex);
  if (ResDesc->ArraySize <= BindInfo->ArrayIndex) {
    FormatString<char[89]>
              (&msg,(char (*) [89])
                    "Index is out of range, but it should\'ve been corrected by ShaderVariableBase::SetArray()"
              );
    in_RCX = (char (*) [109])0x15e;
    DebugAssertionFailed
              ((Char *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_),
               "BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x15e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_) != &msg.field_2) {
      operator_delete((undefined1 *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_),
                      msg.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>)
              .
              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>)
            .m_ResourceCache;
  if ((ResDesc->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV) &&
     (ResDesc->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
    FormatString<char[26],char[109]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV"
               ,in_RCX);
    DebugAssertionFailed
              ((Char *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_),
               "BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x161);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_) != &msg.field_2) {
      operator_delete((undefined1 *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_),
                      msg.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar1 = BindInfo->pObject;
  pViewGL.m_pObject = (BufferViewGLImpl *)0x0;
  if (pIVar1 != (IDeviceObject *)0x0) {
    (**(pIVar1->super_IObject)._vptr_IObject)(pIVar1,IID_BufferViewGL,&pViewGL);
  }
  SignatureName = (char *)0x1b2770;
  pCVar3 = ShaderResourceCacheGL::GetConstSSBO(this_00,BindInfo->ArrayIndex + pRVar2->CacheOffset);
  msg._M_dataplus._M_p._0_2_ = 0x201;
  ExpectedViewTypes._M_len = 1;
  ExpectedViewTypes._M_array = (iterator)0x2;
  VerifyResourceViewBinding<Diligent::BufferViewGLImpl,Diligent::BUFFER_VIEW_TYPE>
            ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,
             (BindResourceInfo *)pViewGL.m_pObject,(BufferViewGLImpl *)&msg,ExpectedViewTypes,
             RESOURCE_DIM_UNDEFINED,SUB81((pCVar3->pBufferView).m_pObject,0),
             (IDeviceObject *)
             (((((this->
                 super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>).
                 super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                .m_ParentManager)->
               super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature)->
             super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,SignatureName);
  if ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[90]>
              (&msg,(char (*) [90])
                    "FORMATTED_BUFFER resource flag is set for a storage buffer - this should\'ve not happened."
              );
    DebugAssertionFailed
              ((Char *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_),
               "BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x171);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_) != &msg.field_2) {
      operator_delete((undefined1 *)CONCAT62(msg._M_dataplus._M_p._2_6_,msg._M_dataplus._M_p._0_2_),
                      msg.field_2._M_allocated_capacity + 1);
    }
  }
  ValidateBufferMode<Diligent::BufferViewGLImpl>(ResDesc,BindInfo->ArrayIndex,pViewGL.m_pObject);
  ShaderResourceCacheGL::SetSSBO(this_00,BindInfo->ArrayIndex + pRVar2->CacheOffset,&pViewGL);
  RefCntAutoPtr<Diligent::BufferViewGLImpl>::Release(&pViewGL);
  return;
}

Assistant:

void ShaderVariableManagerGL::StorageBufferBindInfo::BindResource(const BindResourceInfo& BindInfo)
{
    const auto& Desc = GetDesc();
    const auto& Attr = GetAttribs();

    VERIFY(BindInfo.ArrayIndex < Desc.ArraySize, "Index is out of range, but it should've been corrected by ShaderVariableBase::SetArray()");
    auto& ResourceCache = m_ParentManager.m_ResourceCache;
    VERIFY_EXPR(Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV ||
                Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV);

    // We cannot use ClassPtrCast<> here as the resource can be of wrong type
    RefCntAutoPtr<BufferViewGLImpl> pViewGL{BindInfo.pObject, IID_BufferViewGL};
#ifdef DILIGENT_DEVELOPMENT
    {
        auto& CachedSSBO = ResourceCache.GetConstSSBO(Attr.CacheOffset + BindInfo.ArrayIndex);
        // HLSL structured buffers are mapped to SSBOs in GLSL
        VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                  {BUFFER_VIEW_SHADER_RESOURCE, BUFFER_VIEW_UNORDERED_ACCESS}, // Expected view types
                                  RESOURCE_DIM_BUFFER,                                         // Expected resource dimension
                                  false,                                                       // IsMultisample (ignored when resource dim is buffer)
                                  CachedSSBO.pBufferView.RawPtr(),
                                  m_ParentManager.m_pSignature->GetDesc().Name);

        VERIFY((Desc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == 0,
               "FORMATTED_BUFFER resource flag is set for a storage buffer - this should've not happened.");
        ValidateBufferMode(Desc, BindInfo.ArrayIndex, pViewGL.RawPtr());
    }
#endif
    ResourceCache.SetSSBO(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
}